

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Operation<duckdb::hugeint_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<duckdb::hugeint_t,_duckdb::string_t> *state,hugeint_t *x,string_t *y,
               AggregateBinaryInput *binary)

{
  int64_t iVar1;
  hugeint_t x_data;
  string_t new_value;
  string_t y_data;
  AggregateBinaryInput *in_stack_00000008;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    x_data.upper = *(int64_t *)&y->value;
    x_data.lower = x->upper;
    y_data.value.pointer.ptr = (char *)binary;
    y_data.value._0_8_ = (y->value).pointer.ptr;
    Execute<duckdb::hugeint_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::string_t>>
              ((ArgMinMaxBase<duckdb::LessThan,true> *)state,
               (ArgMinMaxState<duckdb::hugeint_t,_duckdb::string_t> *)x->lower,x_data,y_data,
               in_stack_00000008);
    return;
  }
  iVar1 = x->upper;
  (state->arg).lower = x->lower;
  (state->arg).upper = iVar1;
  new_value.value.pointer.ptr = (char *)binary;
  new_value.value._0_8_ = (y->value).pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->value,*(string_t **)&y->value,new_value);
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}